

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this_00;
  _Base_ptr p_Var2;
  bool bVar3;
  cmValue cVar4;
  long lVar5;
  _Base_ptr p_Var6;
  char cVar7;
  _Base_ptr p_Var8;
  string_view str;
  string local_e0;
  cmOutputConverter *local_c0;
  _Rb_tree_node_base *local_b8;
  string dflag;
  cmAlphaNum local_90;
  string def;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&dflag,"-D",(allocator<char> *)&def);
  if (lang->_M_string_length != 0) {
    this_00 = this->Makefile;
    def._M_dataplus._M_p = &DAT_00000006;
    def._M_string_length = (long)"The CMAKE_" + 4;
    local_90.View_._M_str = (lang->_M_dataplus)._M_p;
    local_90.View_._M_len = lang->_M_string_length;
    cmStrCat<char[13]>(&local_e0,(cmAlphaNum *)&def,&local_90,(char (*) [13])"_DEFINE_FLAG");
    cVar4 = cmMakefile::GetDefinition(this_00,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((cVar4.Value != (string *)0x0) && ((cVar4.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&dflag);
    }
  }
  local_b8 = &(defines->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_c0 = &this->super_cmOutputConverter;
  for (p_Var6 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; p_Var6 != local_b8;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::__cxx11::string::string((string *)&def,(string *)&dflag);
    bVar3 = cmState::UseWatcomWMake
                      ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    if (bVar3) {
      lVar5 = *(long *)(p_Var6 + 1);
      p_Var2 = p_Var6[1]._M_parent;
      for (p_Var8 = (_Base_ptr)0x0; p_Var2 != p_Var8;
          p_Var8 = (_Base_ptr)((long)&p_Var8->_M_color + 1)) {
        cVar7 = (char)&def;
        if ((byte)(*(char *)((long)&p_Var8->_M_color + lVar5) - 0x23U) < 2) {
          std::__cxx11::string::push_back(cVar7);
        }
        std::__cxx11::string::push_back(cVar7);
      }
    }
    else {
      p_Var1 = p_Var6 + 1;
      lVar5 = std::__cxx11::string::find((char)p_Var1,0x3d);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)p_Var1);
      std::__cxx11::string::append((string *)&def);
      std::__cxx11::string::~string((string *)&local_90);
      if (lVar5 != -1) {
        std::__cxx11::string::append((char *)&def);
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)p_Var1);
        str._M_str = local_e0._M_dataplus._M_p;
        str._M_len = local_e0._M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  ((string *)&local_90,local_c0,str,true,false,false,false,false);
        std::__cxx11::string::append((string *)&def);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_e0);
      }
    }
    std::__cxx11::string::append((char *)definesString);
    std::__cxx11::string::append((string *)definesString);
    std::__cxx11::string::~string((string *)&def);
  }
  std::__cxx11::string::~string((string *)&dflag);
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    cmValue df =
      this->Makefile->GetDefinition(cmStrCat("CMAKE_", lang, "_DEFINE_FLAG"));
    if (cmNonempty(df)) {
      dflag = *df;
    }
  }
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (std::string const& define : defines) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (char c : define) {
        if (c == '$' || c == '#') {
          def += '$';
        }
        def += c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = define.find('=');
      def += define.substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(define.substr(eq + 1), true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}